

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  undefined1 auVar1 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  DynamicSize size;
  FormatBuffer buffer;
  DynamicSize local_290;
  uint64_t local_278 [2];
  uint64_t local_268;
  buffer<char> local_258;
  char local_238 [504];
  undefined1 local_40;
  
  local_258.size_ = 0;
  local_258.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_258.capacity_ = 500;
  local_40 = 0;
  local_258.ptr_ = local_238;
  dynamicBitstreamSize(&local_290,bitstream,mode);
  if (local_290.isValid == false) {
    fmt_00.size_ = 10;
    fmt_00.data_ = "<overflow>";
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_278;
    ::fmt::v11::detail::vformat_to(&local_258,fmt_00,(format_args)(auVar1 << 0x40),(locale_ref)0x0);
  }
  else if (local_290.multiplier == 0) {
    local_278[0] = local_290.fixed;
    fmt_01.size_ = 2;
    fmt_01.data_ = "{}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_278;
    args_00.desc_ = 4;
    ::fmt::v11::detail::vformat_to(&local_258,fmt_01,args_00,(locale_ref)0x0);
  }
  else if (local_290.fixed == 0) {
    local_278[0] = local_290.multiplier;
    fmt_02.size_ = 4;
    fmt_02.data_ = "{}*n";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_278;
    args_01.desc_ = 4;
    ::fmt::v11::detail::vformat_to(&local_258,fmt_02,args_01,(locale_ref)0x0);
  }
  else {
    local_278[0] = local_290.multiplier;
    local_268 = local_290.fixed;
    fmt.size_ = 7;
    fmt.data_ = "{}*n+{}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_278;
    args.desc_ = 0x44;
    ::fmt::v11::detail::vformat_to(&local_258,fmt,args,(locale_ref)0x0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_258.ptr_,local_258.ptr_ + local_258.size_);
  if (local_258.ptr_ != local_238) {
    free(local_258.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto size = dynamicBitstreamSize(bitstream, mode);
    if (!size)
        buffer.format("<overflow>");
    else if (!size.multiplier)
        buffer.format("{}", size.fixed);
    else if (!size.fixed)
        buffer.format("{}*n", size.multiplier);
    else
        buffer.format("{}*n+{}", size.multiplier, size.fixed);
    return buffer.str();
}